

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_errors.h
# Opt level: O0

void __thiscall booster::locale::conv::conversion_error::conversion_error(conversion_error *this)

{
  undefined8 *in_RDI;
  string *s;
  runtime_error *in_stack_ffffffffffffffc0;
  undefined1 local_29 [41];
  
  s = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"Conversion failed",(allocator *)s);
  runtime_error::runtime_error(in_stack_ffffffffffffffc0,s);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  *in_RDI = &PTR__conversion_error_00129cd8;
  in_RDI[2] = &PTR__conversion_error_00129d00;
  return;
}

Assistant:

conversion_error() : booster::runtime_error("Conversion failed") {}